

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O1

bool VCXProjectWriter::outputFileConfig
               (OutputFilterData *d,XmlOutput *xml,XmlOutput *xmlFilter,QString *filename,
               QString *fullFilterName,bool fileAdded,bool hasCustomBuildStep)

{
  int iVar1;
  bool bVar2;
  pchOption pVar3;
  Data *pDVar4;
  VCProjectWriter *pVVar5;
  QString str;
  QString string;
  QString string_00;
  int *piVar6;
  QArrayData *pQVar7;
  bool bVar8;
  undefined8 uVar9;
  char16_t *pcVar10;
  undefined1 auVar11 [16];
  QArrayData *pQVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  XmlOutput *pXVar16;
  XmlOutput *pXVar17;
  storage_type *psVar18;
  long in_FS_OFFSET;
  QArrayData *pQVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  undefined8 in_stack_fffffffffffffe28;
  qsizetype in_stack_fffffffffffffe38;
  QString local_1a8;
  QArrayData *local_188;
  Data *pDStack_180;
  char16_t *local_178;
  QArrayData *local_168;
  Data *pDStack_160;
  char16_t *local_158;
  undefined1 local_148 [32];
  undefined1 auStack_128 [16];
  qsizetype qStack_118;
  QString local_108;
  xml_output local_e8;
  undefined1 local_a8 [8];
  undefined1 auStack_a0 [16];
  undefined1 auStack_90 [16];
  undefined1 auStack_80 [16];
  QArrayData *local_68;
  Data *pDStack_60;
  char16_t *local_58;
  QArrayData *local_50;
  char16_t *local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (d->inBuild == true) {
    if (((d->filter).Project)->usePCH == true) {
      local_50 = &((filename->d).d)->super_QArrayData;
      local_48 = (filename->d).ptr;
      local_40 = (filename->d).size;
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&local_50->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_50->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      str.d.ptr._0_4_ = (int)filename;
      str.d.d = (Data *)in_stack_fffffffffffffe28;
      str.d.ptr._4_4_ = (int)((ulong)filename >> 0x20);
      str.d.size = in_stack_fffffffffffffe38;
      VCFilter::modifyPCHstage(&d->filter,str);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,2,0x10);
        }
      }
    }
  }
  else if ((d->info).excludeFromBuild == true) {
    (d->filter).useCompilerTool = true;
  }
  cVar13 = '\x01';
  if ((((hasCustomBuildStep) || ((d->filter).useCustomBuildTool != false)) ||
      ((d->filter).useCompilerTool != false)) || (d->inBuild != true)) {
    bVar2 = false;
  }
  else {
    QVar20.m_data = (storage_type *)0x10;
    QVar20.m_size = (qsizetype)local_a8;
    QString::fromUtf8(QVar20);
    local_68 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
    pDStack_60 = (Data *)auStack_a0._0_8_;
    local_58 = (char16_t *)auStack_a0._8_8_;
    cVar13 = QString::startsWith((QString *)d,(CaseSensitivity)&local_68);
    bVar2 = true;
  }
  if ((bVar2) && (local_68 != (QArrayData *)0x0)) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  if (cVar13 == '\0') goto LAB_0020551d;
  pXVar16 = xml;
  if ((hasCustomBuildStep) || ((d->filter).useCustomBuildTool == true)) {
    if (!fileAdded) {
      QVar21.m_data = (storage_type *)0xb;
      QVar21.m_size = (qsizetype)local_a8;
      QString::fromUtf8(QVar21);
      pQVar7 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      auStack_90._0_8_ = auStack_a0._8_8_;
      local_a8._0_4_ = tTag;
      auStack_a0._8_8_ = auStack_a0._0_8_;
      auStack_a0._0_8_ = pQVar7;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_90._8_8_ = 0;
      auStack_80 = ZEXT816(0);
      pXVar16 = XmlOutput::operator<<(xmlFilter,(xml_output *)local_a8);
      QVar22.m_data = (storage_type *)0x7;
      QVar22.m_size = (qsizetype)&local_e8;
      QString::fromUtf8(QVar22);
      pcVar10 = local_e8.xo_text.d.ptr;
      pDVar4 = local_e8.xo_text.d.d;
      uVar9 = local_e8._0_8_;
      local_e8._0_8_ = (filename->d).d;
      local_e8.xo_text.d.d = (Data *)(filename->d).ptr;
      local_e8.xo_text.d.ptr = (char16_t *)(filename->d).size;
      if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_e8._0_8_)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_e8._0_8_)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      string.d.ptr._0_4_ = (int)filename;
      string.d.d = (Data *)in_stack_fffffffffffffe28;
      string.d.ptr._4_4_ = (int)((ulong)filename >> 0x20);
      string.d.size = (qsizetype)xml;
      Option::fixString(&local_108,string,(uchar)&local_e8);
      pXVar17 = xml;
      if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
          pXVar17 = xml;
        }
      }
      local_e8.xo_type = 8;
      local_e8.xo_text.d.d = (Data *)uVar9;
      local_e8.xo_text.d.ptr = (char16_t *)pDVar4;
      local_e8.xo_text.d.size = (qsizetype)pcVar10;
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e8.xo_value.d.d = local_108.d.d;
      local_e8.xo_value.d.ptr = local_108.d.ptr;
      local_e8.xo_value.d.size = local_108.d.size;
      if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      xml = pXVar17;
      pXVar16 = XmlOutput::operator<<(pXVar16,&local_e8);
      if ((fullFilterName->d).size == 0) {
        local_148._0_4_ = tNothing;
        local_148._8_8_ = (QArrayData *)0x0;
        local_148._16_8_ = (QArrayData *)0x0;
        local_148._24_8_ = (QArrayData *)0x0;
        auStack_128 = ZEXT816(0);
        qStack_118 = 0;
      }
      else {
        QVar23.m_data = (storage_type *)0x6;
        QVar23.m_size = (qsizetype)local_148;
        QString::fromUtf8(QVar23);
        local_148._24_8_ = local_148._16_8_;
        pQVar19 = (QArrayData *)CONCAT44(local_148._4_4_,local_148._0_4_);
        local_148._0_4_ = tTagValue;
        local_148._16_8_ = local_148._8_8_;
        if (pQVar19 != (QArrayData *)0x0) {
          LOCK();
          (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        pDVar4 = (fullFilterName->d).d;
        auStack_128._0_8_ = (fullFilterName->d).d;
        auStack_128._8_8_ = (fullFilterName->d).ptr;
        qStack_118 = (fullFilterName->d).size;
        if (pDVar4 != (Data *)0x0) {
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_148._8_8_ = pQVar19;
        if (pQVar19 != (QArrayData *)0x0) {
          LOCK();
          (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar19->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar19,2,0x10);
          }
        }
      }
      XmlOutput::operator<<(pXVar16,(xml_output *)local_148);
      if ((QArrayData *)auStack_128._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_128._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_148._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_148._8_8_,2,0x10);
        }
      }
      if (&(local_e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
        }
      }
      if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
        }
      }
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
      QVar24.m_data = (storage_type *)0xb;
      QVar24.m_size = (qsizetype)local_a8;
      QString::fromUtf8(QVar24);
      pQVar7 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      auStack_90._0_8_ = auStack_a0._8_8_;
      local_a8._0_4_ = tTag;
      auStack_a0._8_8_ = auStack_a0._0_8_;
      auStack_a0._0_8_ = pQVar7;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_90._8_8_ = 0;
      auStack_80 = ZEXT816(0);
      pXVar16 = XmlOutput::operator<<(pXVar17,(xml_output *)local_a8);
      QVar25.m_data = (storage_type *)0x7;
      QVar25.m_size = (qsizetype)&local_e8;
      QString::fromUtf8(QVar25);
      pcVar10 = local_e8.xo_text.d.ptr;
      pDVar4 = local_e8.xo_text.d.d;
      uVar9 = local_e8._0_8_;
      local_e8._0_8_ = (filename->d).d;
      local_e8.xo_text.d.d = (Data *)(filename->d).ptr;
      local_e8.xo_text.d.ptr = (char16_t *)(filename->d).size;
      if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_e8._0_8_)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_e8._0_8_)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      string_00.d.ptr._0_4_ = (int)filename;
      string_00.d.d = (Data *)in_stack_fffffffffffffe28;
      string_00.d.ptr._4_4_ = (int)((ulong)filename >> 0x20);
      string_00.d.size = (qsizetype)xml;
      Option::fixString((QString *)local_148,string_00,(uchar)&local_e8);
      if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
        }
      }
      local_e8.xo_type = 8;
      local_e8.xo_text.d.d = (Data *)uVar9;
      local_e8.xo_text.d.ptr = (char16_t *)pDVar4;
      local_e8.xo_text.d.size = (qsizetype)pcVar10;
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e8.xo_value.d.d = (Data *)CONCAT44(local_148._4_4_,local_148._0_4_);
      local_e8.xo_value.d.ptr = (char16_t *)local_148._8_8_;
      local_e8.xo_value.d.size = local_148._16_8_;
      if ((QArrayData *)local_e8.xo_value.d.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_e8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_e8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
             1;
        UNLOCK();
      }
      XmlOutput::operator<<(pXVar16,&local_e8);
      if (&(local_e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      piVar6 = (int *)CONCAT44(local_148._4_4_,local_148._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_148._4_4_,local_148._0_4_),2,0x10);
        }
      }
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
        }
      }
      if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
        }
      }
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
      QVar26.m_data = (storage_type *)0xa;
      QVar26.m_size = (qsizetype)local_a8;
      QString::fromUtf8(QVar26);
      local_e8._0_8_ = CONCAT44(local_a8._4_4_,local_a8._0_4_);
      local_e8.xo_text.d.d = (Data *)auStack_a0._0_8_;
      local_e8.xo_text.d.ptr = (char16_t *)auStack_a0._8_8_;
      cVar13 = QString::startsWith((QString *)d,(CaseSensitivity)&local_e8);
      cVar15 = '\x01';
      if (cVar13 == '\0') {
        QVar27.m_data = (storage_type *)0xf;
        QVar27.m_size = (qsizetype)local_a8;
        QString::fromUtf8(QVar27);
        local_108.d.d = (Data *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
        local_108.d.ptr = (char16_t *)auStack_a0._0_8_;
        local_108.d.size = auStack_a0._8_8_;
        cVar14 = QString::startsWith((QString *)d,(CaseSensitivity)&local_108);
        if (cVar14 != '\0') goto LAB_0020448f;
        QVar30.m_data = (storage_type *)0xe;
        QVar30.m_size = (qsizetype)local_a8;
        QString::fromUtf8(QVar30);
        local_168 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
        pDStack_160 = (Data *)auStack_a0._0_8_;
        local_158 = (char16_t *)auStack_a0._8_8_;
        cVar15 = QString::startsWith((QString *)d,(CaseSensitivity)&local_168);
        if (cVar15 == '\0') {
          QVar45.m_data = (storage_type *)0x10;
          QVar45.m_size = (qsizetype)local_a8;
          QString::fromUtf8(QVar45);
          local_188 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
          pDStack_180 = (Data *)auStack_a0._0_8_;
          local_178 = (char16_t *)auStack_a0._8_8_;
          cVar15 = QString::startsWith((QString *)d,(CaseSensitivity)&local_188);
          bVar8 = true;
          bVar2 = true;
        }
        else {
          bVar8 = true;
          bVar2 = false;
          cVar15 = '\x01';
        }
      }
      else {
LAB_0020448f:
        bVar8 = false;
        bVar2 = false;
      }
      if ((bVar2) && (local_188 != (QArrayData *)0x0)) {
        LOCK();
        (local_188->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_188->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_188->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_188,2,0x10);
        }
      }
      if ((bVar8) && (local_168 != (QArrayData *)0x0)) {
        LOCK();
        (local_168->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_168->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_168->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_168,2,0x10);
        }
      }
      if ((cVar13 == '\0') && (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0)) {
        LOCK();
        ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
        }
      }
      fileAdded = true;
      pXVar16 = xml;
      if (cVar15 != '\0') {
        QVar28.m_data = &DAT_00000008;
        QVar28.m_size = (qsizetype)local_a8;
        QString::fromUtf8(QVar28);
        auVar11 = auStack_a0;
        pQVar7 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
        if ((char16_t *)auStack_a0._8_8_ == (char16_t *)0x0) {
          local_a8._0_4_ = tNothing;
          auStack_a0 = (undefined1  [16])0x0;
          auStack_90 = (undefined1  [16])0x0;
          auStack_80 = (undefined1  [16])0x0;
          pXVar16 = xml;
        }
        else {
          QVar29.m_data = &DAT_00000008;
          QVar29.m_size = (qsizetype)local_a8;
          QString::fromUtf8(QVar29);
          pQVar19 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
          auStack_90._0_8_ = auStack_a0._8_8_;
          local_a8._0_4_ = tTagValue;
          auStack_a0._8_8_ = auStack_a0._0_8_;
          auStack_a0._0_8_ = pQVar19;
          if (pQVar19 != (QArrayData *)0x0) {
            LOCK();
            (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          auStack_90._8_8_ = pQVar7;
          auStack_80 = auVar11;
          if (pQVar7 != (QArrayData *)0x0) {
            LOCK();
            (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pXVar16 = xml;
          if (pQVar19 != (QArrayData *)0x0) {
            LOCK();
            (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar19->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar19,2,0x10);
            }
          }
        }
        fileAdded = true;
        XmlOutput::operator<<(xml,(xml_output *)local_a8);
        if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
          }
        }
        if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
          }
        }
        if (pQVar7 != (QArrayData *)0x0) {
          LOCK();
          (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar7,2,0x10);
          }
        }
      }
    }
    pVVar5 = ((d->filter).Project)->projectWriter;
    (*pVVar5->_vptr_VCProjectWriter[8])(pVVar5,xml,&(d->filter).CustomBuildTool);
  }
  if (fileAdded == false) {
    outputFileConfig(xml,xmlFilter,filename,fullFilterName);
    fileAdded = true;
  }
  local_1a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_1a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_1a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  generateCondition(&local_1a8,(d->filter).Config);
  cVar13 = fileAdded;
  if (d->inBuild == false) {
    QVar31.m_data = (storage_type *)0x11;
    QVar31.m_size = (qsizetype)local_a8;
    QString::fromUtf8(QVar31);
    pQVar7 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
    auStack_90._0_8_ = auStack_a0._8_8_;
    local_a8._0_4_ = tTag;
    auStack_a0._8_8_ = auStack_a0._0_8_;
    auStack_a0._0_8_ = pQVar7;
    if (pQVar7 != (QArrayData *)0x0) {
      LOCK();
      (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_90._8_8_ = 0;
    auStack_80 = ZEXT816(0);
    pXVar17 = XmlOutput::operator<<(xml,(xml_output *)local_a8);
    QVar32.m_data = (storage_type *)0x9;
    QVar32.m_size = (qsizetype)&local_e8;
    QString::fromUtf8(QVar32);
    local_e8.xo_text.d.size = (qsizetype)local_e8.xo_text.d.ptr;
    local_e8.xo_text.d.ptr = (char16_t *)local_e8.xo_text.d.d;
    uVar9 = local_e8._0_8_;
    local_e8.xo_type = 8;
    local_e8.xo_text.d.d = (Data *)uVar9;
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e8.xo_value.d.d = local_1a8.d.d;
    local_e8.xo_value.d.ptr = local_1a8.d.ptr;
    local_e8.xo_value.d.size = local_1a8.d.size;
    if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pXVar17 = XmlOutput::operator<<(pXVar17,&local_e8);
    QVar33.m_data = (storage_type *)0x4;
    QVar33.m_size = (qsizetype)local_148;
    QString::fromUtf8(QVar33);
    local_148._24_8_ = local_148._16_8_;
    pQVar19 = (QArrayData *)CONCAT44(local_148._4_4_,local_148._0_4_);
    local_148._0_4_ = tValueTag;
    local_148._16_8_ = local_148._8_8_;
    if (pQVar19 != (QArrayData *)0x0) {
      LOCK();
      (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_128 = ZEXT816(0);
    qStack_118 = 0;
    local_148._8_8_ = pQVar19;
    XmlOutput::operator<<(pXVar17,(xml_output *)local_148);
    xml = pXVar16;
    if ((QArrayData *)auStack_128._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)auStack_128._0_8_,2,0x10);
        xml = pXVar16;
      }
    }
    cVar13 = fileAdded;
    if ((QArrayData *)local_148._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_148._8_8_,2,0x10);
      }
    }
    if (pQVar19 != (QArrayData *)0x0) {
      LOCK();
      (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar19->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar19,2,0x10);
      }
    }
    if (&(local_e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_e8.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    pXVar16 = xml;
    if (&(local_e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_e8.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
      }
    }
    if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
      }
    }
    if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
      }
    }
    if (pQVar7 != (QArrayData *)0x0) {
      LOCK();
      (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar7,2,0x10);
      }
    }
  }
  QVar34.m_data = (storage_type *)0x10;
  QVar34.m_size = (qsizetype)local_a8;
  QString::fromUtf8(QVar34);
  local_e8._0_8_ = CONCAT44(local_a8._4_4_,local_a8._0_4_);
  local_e8.xo_text.d.d = (Data *)auStack_a0._0_8_;
  local_e8.xo_text.d.ptr = (char16_t *)auStack_a0._8_8_;
  cVar15 = QString::startsWith((QString *)d,(CaseSensitivity)&local_e8);
  if (cVar15 == '\0') {
    if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      iVar1 = (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar7 = (QArrayData *)local_e8._0_8_;
joined_r0x00204d28:
      if (iVar1 == 0) {
        QArrayData::deallocate(pQVar7,2,0x10);
      }
    }
  }
  else {
    bVar2 = d->inBuild;
    if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
      }
    }
    if (bVar2 != false) {
      QVar35.m_data = (storage_type *)0x11;
      QVar35.m_size = (qsizetype)local_a8;
      fileAdded = (bool)cVar13;
      QString::fromUtf8(QVar35);
      pQVar7 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      auStack_90._0_8_ = auStack_a0._8_8_;
      local_a8._0_4_ = tTag;
      auStack_a0._8_8_ = auStack_a0._0_8_;
      auStack_a0._0_8_ = pQVar7;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_90._8_8_ = 0;
      auStack_80 = ZEXT816(0);
      pXVar17 = XmlOutput::operator<<(xml,(xml_output *)local_a8);
      QVar36.m_data = (storage_type *)0x9;
      QVar36.m_size = (qsizetype)&local_e8;
      QString::fromUtf8(QVar36);
      local_e8.xo_text.d.size = (qsizetype)local_e8.xo_text.d.ptr;
      local_e8.xo_text.d.ptr = (char16_t *)local_e8.xo_text.d.d;
      uVar9 = local_e8._0_8_;
      local_e8.xo_type = 8;
      local_e8.xo_text.d.d = (Data *)uVar9;
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e8.xo_value.d.d = local_1a8.d.d;
      local_e8.xo_value.d.ptr = local_1a8.d.ptr;
      local_e8.xo_value.d.size = local_1a8.d.size;
      if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pXVar17 = XmlOutput::operator<<(pXVar17,&local_e8);
      QVar37.m_data = (storage_type *)0x4;
      QVar37.m_size = (qsizetype)local_148;
      QString::fromUtf8(QVar37);
      local_148._24_8_ = local_148._16_8_;
      pQVar19 = (QArrayData *)CONCAT44(local_148._4_4_,local_148._0_4_);
      local_148._0_4_ = tValueTag;
      local_148._16_8_ = local_148._8_8_;
      if (pQVar19 != (QArrayData *)0x0) {
        LOCK();
        (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_128 = (undefined1  [16])0x0;
      qStack_118 = 0;
      local_148._8_8_ = pQVar19;
      XmlOutput::operator<<(pXVar17,(xml_output *)local_148);
      xml = pXVar16;
      if ((QArrayData *)auStack_128._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_128._0_8_,2,0x10);
          xml = pXVar16;
        }
      }
      cVar13 = fileAdded;
      if ((QArrayData *)local_148._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_148._8_8_,2,0x10);
        }
      }
      if (pQVar19 != (QArrayData *)0x0) {
        LOCK();
        (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar19->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar19,2,0x10);
        }
      }
      if (&(local_e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      pXVar16 = xml;
      if (&(local_e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
        }
      }
      if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
        }
      }
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        iVar1 = (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        goto joined_r0x00204d28;
      }
    }
  }
  if ((d->filter).useCompilerTool == true) {
    if ((d->filter).CompilerTool.ForcedIncludeFiles.d.size != 0) {
      QVar38.m_data = (storage_type *)0x12;
      QVar38.m_size = (qsizetype)local_a8;
      fileAdded = (bool)cVar13;
      QString::fromUtf8(QVar38);
      pQVar7 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      auStack_90._0_8_ = auStack_a0._8_8_;
      local_a8._0_4_ = tTag;
      auStack_a0._8_8_ = auStack_a0._0_8_;
      auStack_a0._0_8_ = pQVar7;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_90._8_8_ = 0;
      auStack_80 = ZEXT816(0);
      pXVar17 = XmlOutput::operator<<(xml,(xml_output *)local_a8);
      QVar39.m_data = (storage_type *)0x9;
      QVar39.m_size = (qsizetype)&local_e8;
      QString::fromUtf8(QVar39);
      local_e8.xo_text.d.size = (qsizetype)local_e8.xo_text.d.ptr;
      local_e8.xo_text.d.ptr = (char16_t *)local_e8.xo_text.d.d;
      uVar9 = local_e8._0_8_;
      local_e8.xo_type = 8;
      local_e8.xo_text.d.d = (Data *)uVar9;
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e8.xo_value.d.d = local_1a8.d.d;
      local_e8.xo_value.d.ptr = local_1a8.d.ptr;
      local_e8.xo_value.d.size = local_1a8.d.size;
      if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pXVar17 = XmlOutput::operator<<(pXVar17,&local_e8);
      valueTagX((xml_output *)local_148,&(d->filter).CompilerTool.ForcedIncludeFiles," ");
      XmlOutput::operator<<(pXVar17,(xml_output *)local_148);
      xml = pXVar16;
      if ((QArrayData *)auStack_128._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_128._0_8_,2,0x10);
          xml = pXVar16;
        }
      }
      pXVar16 = xml;
      cVar13 = fileAdded;
      if ((QArrayData *)local_148._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_148._8_8_,2,0x10);
        }
      }
      if (&(local_e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
        }
      }
      if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
        }
      }
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
    }
    if ((d->filter).CompilerTool.PrecompiledHeaderThrough.d.size != 0) {
      QVar40.m_data = (storage_type *)0x15;
      QVar40.m_size = (qsizetype)local_a8;
      fileAdded = (bool)cVar13;
      QString::fromUtf8(QVar40);
      pQVar7 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      auStack_90._0_8_ = auStack_a0._8_8_;
      local_a8._0_4_ = tTag;
      auStack_a0._8_8_ = auStack_a0._0_8_;
      auStack_a0._0_8_ = pQVar7;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_90._8_8_ = 0;
      auStack_80 = ZEXT816(0);
      pXVar17 = XmlOutput::operator<<(xml,(xml_output *)local_a8);
      QVar41.m_data = (storage_type *)0x9;
      QVar41.m_size = (qsizetype)&local_e8;
      QString::fromUtf8(QVar41);
      local_e8.xo_text.d.size = (qsizetype)local_e8.xo_text.d.ptr;
      local_e8.xo_text.d.ptr = (char16_t *)local_e8.xo_text.d.d;
      uVar9 = local_e8._0_8_;
      local_e8.xo_type = 8;
      local_e8.xo_text.d.d = (Data *)uVar9;
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e8.xo_value.d.d = local_1a8.d.d;
      local_e8.xo_value.d.ptr = local_1a8.d.ptr;
      local_e8.xo_value.d.size = local_1a8.d.size;
      if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pXVar17 = XmlOutput::operator<<(pXVar17,&local_e8);
      local_148._0_4_ = tValueTag;
      local_148._8_8_ = (d->filter).CompilerTool.PrecompiledHeaderThrough.d.d;
      local_148._16_8_ = (d->filter).CompilerTool.PrecompiledHeaderThrough.d.ptr;
      local_148._24_8_ = (d->filter).CompilerTool.PrecompiledHeaderThrough.d.size;
      if ((QArrayData *)local_148._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_148._8_8_)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_148._8_8_)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_128 = (undefined1  [16])0x0;
      qStack_118 = 0;
      cVar13 = fileAdded;
      XmlOutput::operator<<(pXVar17,(xml_output *)local_148);
      xml = pXVar16;
      if ((QArrayData *)auStack_128._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_128._0_8_,2,0x10);
          xml = pXVar16;
        }
      }
      if ((QArrayData *)local_148._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_148._8_8_,2,0x10);
        }
      }
      if (&(local_e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
        }
      }
      if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
        }
      }
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
    }
    if ((d->filter).CompilerTool.UsePrecompiledHeader != pchUnset) {
      QVar42.m_data = (storage_type *)0x11;
      QVar42.m_size = (qsizetype)local_a8;
      fileAdded = (bool)cVar13;
      QString::fromUtf8(QVar42);
      pQVar7 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      auStack_90._0_8_ = auStack_a0._8_8_;
      local_a8._0_4_ = tTag;
      auStack_a0._8_8_ = auStack_a0._0_8_;
      auStack_a0._0_8_ = pQVar7;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_90._8_8_ = 0;
      auStack_80 = ZEXT816(0);
      pXVar16 = XmlOutput::operator<<(xml,(xml_output *)local_a8);
      QVar43.m_data = (storage_type *)0x9;
      QVar43.m_size = (qsizetype)&local_e8;
      QString::fromUtf8(QVar43);
      local_e8.xo_text.d.size = (qsizetype)local_e8.xo_text.d.ptr;
      local_e8.xo_text.d.ptr = (char16_t *)local_e8.xo_text.d.d;
      uVar9 = local_e8._0_8_;
      local_e8.xo_type = 8;
      local_e8.xo_text.d.d = (Data *)uVar9;
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e8.xo_value.d.d = local_1a8.d.d;
      local_e8.xo_value.d.ptr = local_1a8.d.ptr;
      local_e8.xo_value.d.size = local_1a8.d.size;
      if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pXVar16 = XmlOutput::operator<<(pXVar16,&local_e8);
      pVar3 = (d->filter).CompilerTool.UsePrecompiledHeader;
      if (pVar3 == pchUseUsingSpecific) {
        psVar18 = (storage_type *)0x3;
LAB_00205347:
        QVar44.m_data = psVar18;
        QVar44.m_size = (qsizetype)local_148;
        QString::fromUtf8(QVar44);
        pQVar19 = (QArrayData *)CONCAT44(local_148._4_4_,local_148._0_4_);
      }
      else {
        if (pVar3 == pchCreateUsingSpecific) {
          psVar18 = (storage_type *)0x6;
          goto LAB_00205347;
        }
        if (pVar3 == pchNone) {
          psVar18 = &DAT_00000008;
          goto LAB_00205347;
        }
        pQVar19 = (QArrayData *)0x0;
        local_148._8_8_ = (QArrayData *)0x0;
        local_148._16_8_ = (QArrayData *)0x0;
      }
      local_148._0_4_ = tValueTag;
      if (pQVar19 != (QArrayData *)0x0) {
        LOCK();
        (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      auStack_128 = (undefined1  [16])0x0;
      qStack_118 = 0;
      pQVar12 = (QArrayData *)local_148._8_8_;
      local_148._8_8_ = pQVar19;
      local_148._24_8_ = local_148._16_8_;
      local_148._16_8_ = pQVar12;
      XmlOutput::operator<<(pXVar16,(xml_output *)local_148);
      if ((QArrayData *)auStack_128._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_128._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_148._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_148._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_148._8_8_,2,0x10);
        }
      }
      if (pQVar19 != (QArrayData *)0x0) {
        LOCK();
        (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar19->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar19,2,0x10);
        }
      }
      if (&(local_e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_e8.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
        }
      }
      if ((QArrayData *)auStack_90._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_90._8_8_,2,0x10);
        }
      }
      if ((QArrayData *)auStack_a0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_a0._0_8_,2,0x10);
        }
      }
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
    }
  }
  if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0020551d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return fileAdded;
  }
  __stack_chk_fail();
}

Assistant:

bool VCXProjectWriter::outputFileConfig(OutputFilterData *d, XmlOutput &xml, XmlOutput &xmlFilter,
                                        const QString &filename, const QString &fullFilterName,
                                        bool fileAdded, bool hasCustomBuildStep)
{
    VCFilter &filter = d->filter;
    if (d->inBuild) {
        if (filter.Project->usePCH)
            filter.modifyPCHstage(filename);
    } else {
        // Excluded files uses an empty compiler stage
        if (d->info.excludeFromBuild)
            filter.useCompilerTool = true;
    }

    // Actual XML output ----------------------------------
    if (hasCustomBuildStep || filter.useCustomBuildTool || filter.useCompilerTool
            || !d->inBuild || filter.Name.startsWith("Deployment Files")) {

        if (hasCustomBuildStep || filter.useCustomBuildTool)
        {
            if (!fileAdded) {
                fileAdded = true;

                xmlFilter << tag("CustomBuild")
                    << attrTag("Include", Option::fixPathToTargetOS(filename))
                    << attrTagS("Filter", fullFilterName);

                xml << tag("CustomBuild")
                    << attrTag("Include", Option::fixPathToTargetOS(filename));

                if (filter.Name.startsWith("Form Files")
                        || filter.Name.startsWith("Generated Files")
                        || filter.Name.startsWith("Resource Files")
                        || filter.Name.startsWith("Deployment Files"))
                    xml << attrTagS("FileType", "Document");
            }

            filter.Project->projectWriter->write(xml, filter.CustomBuildTool);
        }

        if (!fileAdded)
        {
            fileAdded = true;
            outputFileConfig(xml, xmlFilter, filename, fullFilterName);
        }

        const QString condition = generateCondition(*filter.Config);
        if (!d->inBuild) {
            xml << tag("ExcludedFromBuild")
                << attrTag("Condition", condition)
                << valueTag("true");
        }

        if (filter.Name.startsWith("Deployment Files") && d->inBuild) {
            xml << tag("DeploymentContent")
                << attrTag("Condition", condition)
                << valueTag("true");
        }

        if (filter.useCompilerTool) {

            if ( !filter.CompilerTool.ForcedIncludeFiles.isEmpty() ) {
                xml << tag("ForcedIncludeFiles")
                    << attrTag("Condition", condition)
                    << valueTagX(filter.CompilerTool.ForcedIncludeFiles);
            }

            if ( !filter.CompilerTool.PrecompiledHeaderThrough.isEmpty() ) {
                xml << tag("PrecompiledHeaderFile")
                    << attrTag("Condition", condition)
                    << valueTag(filter.CompilerTool.PrecompiledHeaderThrough);
            }

            if (filter.CompilerTool.UsePrecompiledHeader != pchUnset) {
                xml << tag("PrecompiledHeader")
                    << attrTag("Condition", condition)
                    << valueTag(toString(filter.CompilerTool.UsePrecompiledHeader));
            }
        }
    }

    return fileAdded;
}